

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O0

void __thiscall DArgs::RemoveArgs(DArgs *this,char *check)

{
  bool bVar1;
  int argindex;
  uint uVar2;
  FString *pFVar3;
  char *pcVar4;
  int i;
  char *check_local;
  DArgs *this_local;
  
  argindex = CheckParm(this,check,1);
  if ((0 < argindex) &&
     (uVar2 = TArray<FString,_FString>::Size(&this->Argv), argindex < (int)(uVar2 - 1))) {
    do {
      RemoveArg(this,argindex);
      pFVar3 = TArray<FString,_FString>::operator[](&this->Argv,(long)argindex);
      pcVar4 = FString::operator[](pFVar3,0);
      bVar1 = false;
      if (*pcVar4 != '+') {
        pFVar3 = TArray<FString,_FString>::operator[](&this->Argv,(long)argindex);
        pcVar4 = FString::operator[](pFVar3,0);
        bVar1 = false;
        if (*pcVar4 != '-') {
          uVar2 = TArray<FString,_FString>::Size(&this->Argv);
          bVar1 = argindex < (int)(uVar2 - 1);
        }
      }
    } while (bVar1);
  }
  return;
}

Assistant:

void DArgs::RemoveArgs(const char *check)
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		do 
		{
			RemoveArg(i);
		}
		while (Argv[i][0] != '+' && Argv[i][0] != '-' && i < (int)Argv.Size() - 1);
	}
}